

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_FontFaceQuartet * __thiscall
ON_Font::FontQuartet(ON_FontFaceQuartet *__return_storage_ptr__,ON_Font *this)

{
  ON_Font *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  wchar_t *pwVar4;
  ulong uVar5;
  ulong uVar6;
  ON_wString *pOVar7;
  long lVar8;
  undefined1 auStack_68 [16];
  ON_SHA1_Hash local_58;
  ON_SHA1_Hash local_44;
  
  QuartetName((ON_Font *)auStack_68);
  this_00 = (ON_Font *)(auStack_68 + 8);
  RichTextFontName(this_00);
  pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)auStack_68);
  FontNameHash(&local_58,pwVar4,false);
  pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this_00);
  FontNameHash(&local_44,pwVar4,false);
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)auStack_68);
  bVar2 = ON_wString::IsNotEmpty((ON_wString *)this_00);
  if (bVar2) {
    bVar3 = ON_wString::IsEmpty((ON_wString *)auStack_68);
    bVar2 = true;
    if (!bVar3) {
      bVar2 = ::operator!=(&local_58,&local_44);
    }
  }
  else {
    bVar2 = false;
  }
  uVar6 = (ulong)!bVar1;
  pOVar7 = (ON_wString *)(auStack_68 + uVar6 * 8);
  for (uVar5 = uVar6; uVar5 <= bVar2; uVar5 = uVar5 + 1) {
    ON_ManagedFonts::InstalledFonts();
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(pOVar7);
    ON_FontList::QuartetFromQuartetName
              (__return_storage_ptr__,&ON_ManagedFonts::List.m_installed_fonts,pwVar4);
    bVar1 = ON_FontFaceQuartet::IsNotEmpty(__return_storage_ptr__);
    if (bVar1) goto LAB_004a3571;
    ON_wString::~ON_wString(&__return_storage_ptr__->m_quartet_name);
    pOVar7 = pOVar7 + 1;
  }
  pOVar7 = (ON_wString *)(auStack_68 + uVar6 * 8);
  for (; uVar6 <= bVar2; uVar6 = uVar6 + 1) {
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(pOVar7);
    ON_FontList::QuartetFromQuartetName
              (__return_storage_ptr__,&ON_ManagedFonts::List.m_managed_fonts,pwVar4);
    bVar1 = ON_FontFaceQuartet::IsNotEmpty(__return_storage_ptr__);
    if (bVar1) goto LAB_004a3571;
    ON_wString::~ON_wString(&__return_storage_ptr__->m_quartet_name);
    pOVar7 = pOVar7 + 1;
  }
  ON_FontFaceQuartet::ON_FontFaceQuartet(__return_storage_ptr__,&ON_FontFaceQuartet::Empty);
LAB_004a3571:
  lVar8 = 8;
  do {
    ON_wString::~ON_wString((ON_wString *)(auStack_68 + lVar8));
    lVar8 = lVar8 + -8;
  } while (lVar8 != -8);
  return __return_storage_ptr__;
}

Assistant:

const ON_FontFaceQuartet ON_Font::FontQuartet() const
{
  const ON_wString quartet_name[2] = { QuartetName(), this->RichTextFontName() };
  const ON_SHA1_Hash quartet_name_hash[2] = { ON_Font::FontNameHash(quartet_name[0],false), ON_Font::FontNameHash(quartet_name[1],false) };
  
  const int imin = quartet_name[0].IsNotEmpty() ? 0 : 1;
  const int imax = (quartet_name[1].IsNotEmpty() && (quartet_name[0].IsEmpty() || quartet_name_hash[0] != quartet_name_hash[1])) ? 1 : 0;

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet installed_quartet = ON_Font::InstalledFontList().QuartetFromQuartetName(quartet_name[i]);
    if (installed_quartet.IsNotEmpty())
      return installed_quartet;
  }

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet managed_quartet = ON_Font::ManagedFontList().QuartetFromQuartetName(quartet_name[i]);
    if (managed_quartet.IsNotEmpty())
      return managed_quartet;
  }

  return ON_FontFaceQuartet::Empty;
}